

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void MatrixPrint(Matrix *a)

{
  uint32_t in_ECX;
  uint32_t row;
  uint uVar1;
  uint32_t col;
  uint rows;
  char *pcVar2;
  
  putchar(0x7b);
  for (uVar1 = 0; uVar1 < a->rows; uVar1 = uVar1 + 1) {
    putchar(0x7b);
    for (rows = 0; rows < a->columns; rows = rows + 1) {
      pcVar2 = "%Lf";
      if (rows < a->columns - 1) {
        pcVar2 = "%Lf,";
      }
      MatrixGetElement((Real *)a,(Matrix *)(ulong)uVar1,rows,in_ECX);
      printf(pcVar2);
    }
    pcVar2 = "}";
    if (uVar1 < a->rows - 1) {
      pcVar2 = "},";
    }
    printf("%s",pcVar2);
  }
  puts("}");
  return;
}

Assistant:

void MatrixPrint(const Matrix *a) {
  printf("{");
  for (uint32_t row = 0; row < a->rows; ++row) {
    printf("{");
    for (uint32_t col = 0; col < a->columns; ++col) {
      printf(col < a->columns - 1 ? "%Lf," : "%Lf", MatrixGetElement(a, row, col));
    }
    printf("%s", row < a->rows - 1 ? "}," : "}");
  }
  printf("}\n");
}